

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O1

void testStructuredErrorHandler(void *ctx,xmlErrorPtr err)

{
  uint uVar1;
  xmlErrorLevel xVar2;
  int iVar3;
  void *pvVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  void *data;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar8;
  uint uVar9;
  char *chanl;
  long lVar10;
  xmlParserInputPtr input;
  xmlChar buf [150];
  xmlParserInputPtr local_e0;
  char local_c8 [152];
  
  if (err == (xmlErrorPtr)0x0) {
    return;
  }
  uVar1 = err->domain;
  pvVar8 = (void *)0x0;
  if ((uVar1 < 0x18) && ((0x80013aU >> (uVar1 & 0x1f) & 1) != 0)) {
    pvVar8 = err->ctxt;
  }
  if (err->code == 0) {
    return;
  }
  pvVar4 = err->node;
  if ((pvVar4 == (void *)0x0) || (*(int *)((long)pvVar4 + 8) != 1)) {
    lVar10 = 0;
  }
  else {
    lVar10 = *(long *)((long)pvVar4 + 0x10);
  }
  xVar2 = err->level;
  uVar9 = err->line;
  pcVar7 = err->message;
  if (pvVar8 == (void *)0x0) {
    if (err->file == (char *)0x0) {
      if (uVar9 != 0 && uVar1 == 1) {
        channel(ctx,"Entity: line %d: ",(ulong)uVar9);
      }
    }
    else {
      channel(ctx,"%s:%d: ");
    }
    local_e0 = (xmlParserInputPtr)0x0;
    input = (xmlParserInputPtr)0x0;
    goto LAB_00102b7a;
  }
  input = *(xmlParserInputPtr *)((long)pvVar8 + 0x38);
  if (input == (xmlParserInputPtr)0x0) {
    local_e0 = (xmlParserInputPtr)0x0;
LAB_00102aee:
    input = (xmlParserInputPtr)0x0;
  }
  else {
    local_e0 = input;
    if ((input->filename != (char *)0x0) || ((long)*(int *)((long)pvVar8 + 0x40) < 2))
    goto LAB_00102aee;
    local_e0 = *(xmlParserInputPtr *)
                (*(long *)((long)pvVar8 + 0x48) + -0x10 + (long)*(int *)((long)pvVar8 + 0x40) * 8);
  }
  if (local_e0 == (xmlParserInputPtr)0x0) {
    local_e0 = (xmlParserInputPtr)0x0;
  }
  else if (local_e0->filename == (char *)0x0) {
    if (uVar9 != 0 && uVar1 == 1) {
      channel(ctx,"Entity: line %d: ",(ulong)(uint)local_e0->line);
    }
  }
  else {
    channel(ctx,"%s:%d: ",local_e0->filename,(ulong)(uint)local_e0->line);
  }
LAB_00102b7a:
  if (lVar10 != 0) {
    channel(ctx,"element %s: ",lVar10);
  }
  uVar5 = uVar1 - 1;
  if ((uVar5 < 0x1a) && ((0x27fbcfdU >> (uVar5 & 0x1f) & 1) != 0)) {
    channel(ctx,&DAT_0010440c + *(int *)(&DAT_0010440c + (ulong)uVar5 * 4));
  }
  if (xVar2 < 4) {
    channel(ctx,&DAT_00104474 + *(int *)(&DAT_00104474 + (ulong)xVar2 * 4));
  }
  if (pcVar7 == (char *)0x0) {
    chanl = "%s\n";
    pcVar7 = "out of memory error";
  }
  else {
    ctx = pcVar7;
    uVar5 = xmlStrlen();
    if (((int)uVar5 < 1) || (pcVar7[(ulong)uVar5 - 1] == '\n')) {
      chanl = "%s";
    }
    else {
      chanl = "%s\n";
    }
  }
  channel(ctx,chanl,pcVar7);
  if ((pvVar8 != (void *)0x0) &&
     (xmlParserPrintFileContextInternal(local_e0,(xmlGenericErrorFunc)chanl,data),
     input != (xmlParserInputPtr)0x0)) {
    if (input->filename == (char *)0x0) {
      pvVar8 = (void *)0x0;
      if (uVar9 != 0 && uVar1 == 1) {
        chanl = "Entity: line %d: \n";
        channel(local_e0,"Entity: line %d: \n",(ulong)(uint)input->line);
        pvVar8 = extraout_RDX_00;
      }
    }
    else {
      chanl = "%s:%d: \n";
      channel(local_e0,"%s:%d: \n",input->filename,(ulong)(uint)input->line);
      pvVar8 = extraout_RDX;
    }
    xmlParserPrintFileContextInternal(input,(xmlGenericErrorFunc)chanl,pvVar8);
  }
  if ((((uVar1 == 0xc) && (pcVar7 = err->str1, pcVar7 != (char *)0x0)) &&
      (iVar3 = err->int1, iVar3 < 100)) && (iVar6 = xmlStrlen(), iVar3 < iVar6)) {
    channel(pcVar7,"%s\n",err->str1);
    uVar1 = err->int1;
    uVar9 = 0;
    if (0 < (long)(int)uVar1) {
      pcVar7 = local_c8;
      memset(pcVar7,0x20,(long)(int)uVar1);
      uVar9 = uVar1;
    }
    (local_c8 + uVar9)[0] = '^';
    (local_c8 + uVar9)[1] = '\0';
    channel(pcVar7,"%s\n",local_c8);
  }
  return;
}

Assistant:

static void
testStructuredErrorHandler(void *ctx  ATTRIBUTE_UNUSED, xmlErrorPtr err) {
    char *file = NULL;
    int line = 0;
    int code = -1;
    int domain;
    void *data = NULL;
    const char *str;
    const xmlChar *name = NULL;
    xmlNodePtr node;
    xmlErrorLevel level;
    xmlParserInputPtr input = NULL;
    xmlParserInputPtr cur = NULL;
    xmlParserCtxtPtr ctxt = NULL;

    if (err == NULL)
        return;

    file = err->file;
    line = err->line;
    code = err->code;
    domain = err->domain;
    level = err->level;
    node = err->node;
    if ((domain == XML_FROM_PARSER) || (domain == XML_FROM_HTML) ||
        (domain == XML_FROM_DTD) || (domain == XML_FROM_NAMESPACE) ||
	(domain == XML_FROM_IO) || (domain == XML_FROM_VALID)) {
	ctxt = err->ctxt;
    }
    str = err->message;

    if (code == XML_ERR_OK)
        return;

    if ((node != NULL) && (node->type == XML_ELEMENT_NODE))
        name = node->name;

    /*
     * Maintain the compatibility with the legacy error handling
     */
    if (ctxt != NULL) {
        input = ctxt->input;
        if ((input != NULL) && (input->filename == NULL) &&
            (ctxt->inputNr > 1)) {
            cur = input;
            input = ctxt->inputTab[ctxt->inputNr - 2];
        }
        if (input != NULL) {
            if (input->filename)
                channel(data, "%s:%d: ", input->filename, input->line);
            else if ((line != 0) && (domain == XML_FROM_PARSER))
                channel(data, "Entity: line %d: ", input->line);
        }
    } else {
        if (file != NULL)
            channel(data, "%s:%d: ", file, line);
        else if ((line != 0) && (domain == XML_FROM_PARSER))
            channel(data, "Entity: line %d: ", line);
    }
    if (name != NULL) {
        channel(data, "element %s: ", name);
    }
    if (code == XML_ERR_OK)
        return;
    switch (domain) {
        case XML_FROM_PARSER:
            channel(data, "parser ");
            break;
        case XML_FROM_NAMESPACE:
            channel(data, "namespace ");
            break;
        case XML_FROM_DTD:
        case XML_FROM_VALID:
            channel(data, "validity ");
            break;
        case XML_FROM_HTML:
            channel(data, "HTML parser ");
            break;
        case XML_FROM_MEMORY:
            channel(data, "memory ");
            break;
        case XML_FROM_OUTPUT:
            channel(data, "output ");
            break;
        case XML_FROM_IO:
            channel(data, "I/O ");
            break;
        case XML_FROM_XINCLUDE:
            channel(data, "XInclude ");
            break;
        case XML_FROM_XPATH:
            channel(data, "XPath ");
            break;
        case XML_FROM_XPOINTER:
            channel(data, "parser ");
            break;
        case XML_FROM_REGEXP:
            channel(data, "regexp ");
            break;
        case XML_FROM_MODULE:
            channel(data, "module ");
            break;
        case XML_FROM_SCHEMASV:
            channel(data, "Schemas validity ");
            break;
        case XML_FROM_SCHEMASP:
            channel(data, "Schemas parser ");
            break;
        case XML_FROM_RELAXNGP:
            channel(data, "Relax-NG parser ");
            break;
        case XML_FROM_RELAXNGV:
            channel(data, "Relax-NG validity ");
            break;
        case XML_FROM_CATALOG:
            channel(data, "Catalog ");
            break;
        case XML_FROM_C14N:
            channel(data, "C14N ");
            break;
        case XML_FROM_XSLT:
            channel(data, "XSLT ");
            break;
        default:
            break;
    }
    if (code == XML_ERR_OK)
        return;
    switch (level) {
        case XML_ERR_NONE:
            channel(data, ": ");
            break;
        case XML_ERR_WARNING:
            channel(data, "warning : ");
            break;
        case XML_ERR_ERROR:
            channel(data, "error : ");
            break;
        case XML_ERR_FATAL:
            channel(data, "error : ");
            break;
    }
    if (code == XML_ERR_OK)
        return;
    if (str != NULL) {
        int len;
	len = xmlStrlen((const xmlChar *)str);
	if ((len > 0) && (str[len - 1] != '\n'))
	    channel(data, "%s\n", str);
	else
	    channel(data, "%s", str);
    } else {
        channel(data, "%s\n", "out of memory error");
    }
    if (code == XML_ERR_OK)
        return;

    if (ctxt != NULL) {
        xmlParserPrintFileContextInternal(input, channel, data);
        if (cur != NULL) {
            if (cur->filename)
                channel(data, "%s:%d: \n", cur->filename, cur->line);
            else if ((line != 0) && (domain == XML_FROM_PARSER))
                channel(data, "Entity: line %d: \n", cur->line);
            xmlParserPrintFileContextInternal(cur, channel, data);
        }
    }
    if ((domain == XML_FROM_XPATH) && (err->str1 != NULL) &&
        (err->int1 < 100) &&
	(err->int1 < xmlStrlen((const xmlChar *)err->str1))) {
	xmlChar buf[150];
	int i;

	channel(data, "%s\n", err->str1);
	for (i=0;i < err->int1;i++)
	     buf[i] = ' ';
	buf[i++] = '^';
	buf[i] = 0;
	channel(data, "%s\n", buf);
    }
}